

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse_data.cpp
# Opt level: O0

void __thiscall
test_csr_data_resize_Test::test_csr_data_resize_Test(test_csr_data_resize_Test *this)

{
  test_csr_data_resize_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__test_csr_data_resize_Test_001b85d8;
  return;
}

Assistant:

TEST(test_csr_data, resize) {

  CSR_Data<Scalar> data{};

  // Death test
  EXPECT_DEATH(resize(data, -1, 1), ".*");
  EXPECT_DEATH(resize(data, 1, -1), ".*");

  // check row and column expansion
  resize(data, 5, 9);
  EXPECT_EQ(size_row(data), 5);
  EXPECT_EQ(size_column(data), 9);
  EXPECT_EQ(size_non_zero(data), 0);

  // check row reduction
  data = CSR_Data<Scalar>({.row_offset = {0, 2, 5, 5, 7},
                           .i_column = {1, 3, 0, 2, 3, 3, 4},
                           .value = {1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0},
                           .columns = 5});
  resize(data, 3, 5);
  EXPECT_EQ(size_row(data), 3);
  EXPECT_EQ(size_column(data), 5);
  EXPECT_EQ(size_non_zero(data), 5);

  // check column reduction
  data = CSR_Data<Scalar>({.row_offset = {0, 2, 5, 5, 7},
                           .i_column = {1, 3, 0, 2, 3, 3, 4},
                           .value = {1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0},
                           .columns = 5});
  resize(data, 4, 2);
  EXPECT_EQ(size_row(data), 4);
  EXPECT_EQ(size_column(data), 2);
  EXPECT_EQ(size_non_zero(data), 2);
  // row 0
  EXPECT_EQ(data.row_offset[0], 0);
  EXPECT_EQ(data.i_column[0], 1);
  EXPECT_EQ(data.value[0], 1.0);
  // row 1
  EXPECT_EQ(data.row_offset[1], 1);
  EXPECT_EQ(data.i_column[1], 0);
  EXPECT_EQ(data.value[1], 3.0);
  // end
  EXPECT_EQ(data.row_offset[2], 2);

  // check row reduction with column expansion
  data = CSR_Data<Scalar>({.row_offset = {0, 2, 5, 5, 7},
                           .i_column = {1, 3, 0, 2, 3, 3, 4},
                           .value = {1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0},
                           .columns = 5});
  resize(data, 2, 8);
  EXPECT_EQ(size_row(data), 2);
  EXPECT_EQ(size_column(data), 8);
  EXPECT_EQ(size_non_zero(data), 5);
  // row 0
  EXPECT_EQ(data.row_offset[0], 0);
  EXPECT_EQ(data.i_column[0], 1);
  EXPECT_EQ(data.value[0], 1.0);
  EXPECT_EQ(data.i_column[1], 3);
  EXPECT_EQ(data.value[1], 2.0);
  // row 1
  EXPECT_EQ(data.row_offset[1], 2);
  EXPECT_EQ(data.i_column[2], 0);
  EXPECT_EQ(data.value[2], 3.0);
  EXPECT_EQ(data.i_column[3], 2);
  EXPECT_EQ(data.value[3], 4.0);
  EXPECT_EQ(data.i_column[4], 3);
  EXPECT_EQ(data.value[4], 5.0);
  // end
  EXPECT_EQ(data.row_offset[2], 5);

  // check row expansion with column reduction
  data = CSR_Data<Scalar>({.row_offset = {0, 2, 5, 5, 7},
                           .i_column = {1, 3, 0, 2, 3, 3, 4},
                           .value = {1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0},
                           .columns = 5});
  resize(data, 10, 2);
  EXPECT_EQ(size_row(data), 10);
  EXPECT_EQ(size_column(data), 2);
  EXPECT_EQ(size_non_zero(data), 2);
  // row 0
  EXPECT_EQ(data.row_offset[0], 0);
  EXPECT_EQ(data.i_column[0], 1);
  EXPECT_EQ(data.value[0], 1.0);
  // row 1
  EXPECT_EQ(data.row_offset[1], 1);
  EXPECT_EQ(data.i_column[1], 0);
  EXPECT_EQ(data.value[1], 3.0);
  // end
  EXPECT_EQ(data.row_offset[2], 2);

  // check row and column reduction
  data = CSR_Data<Scalar>({.row_offset = {0, 2, 5, 5, 7},
                           .i_column = {1, 3, 0, 2, 3, 3, 4},
                           .value = {1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0},
                           .columns = 5});
  resize(data, 1, 2);
  EXPECT_EQ(size_row(data), 1);
  EXPECT_EQ(size_column(data), 2);
  EXPECT_EQ(size_non_zero(data), 1);
  // row 0
  EXPECT_EQ(data.row_offset[0], 0);
  EXPECT_EQ(data.i_column[0], 1);
  EXPECT_EQ(data.value[0], 1.0);
  EXPECT_EQ(data.row_offset[1], 1);

  // check zero sizing.
  data = CSR_Data<Scalar>({.row_offset = {0, 2, 5, 5, 7},
                           .i_column = {1, 3, 0, 2, 3, 3, 4},
                           .value = {1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0},
                           .columns = 5});
  resize(data, 0, 0);
  EXPECT_EQ(size_row(data), 0);
  EXPECT_EQ(size_column(data), 0);
  EXPECT_EQ(size_non_zero(data), 0);
}